

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_serial_writer_test.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  size_t *this;
  size_t *this_00;
  undefined1 local_60 [8];
  DateTimeData dt;
  ApplicationXimuWriter writer;
  RegisterData reg;
  
  this = &dt._seconds;
  dt._seconds = (size_t)&PTR_sendSerialBuffer_00106d98;
  writer.super_WriterBase._vptr_WriterBase = (_func_int **)0x0;
  ximu::WriterBase::sendCommandPacket((WriterBase *)this,ALGORITHM_CLEAR_TARE);
  ximu::WriterBase::sendCommandPacket((WriterBase *)this,ALGORITHM_INITIALISE_THEN_TARE);
  this_00 = &writer._send;
  ximu::RegisterData::RegisterData((RegisterData *)this_00,ACCELEROMETER_BIAS_X,1.0);
  ximu::WriterBase::sendReadRegisterPacket((WriterBase *)this,(RegisterData *)this_00);
  ximu::WriterBase::sendWriteRegisterPacket((WriterBase *)this,(RegisterData *)this_00);
  ximu::WriterBase::sendReadDateTimePacket((WriterBase *)this);
  ximu::DateTimeData::DateTimeData((DateTimeData *)local_60);
  ximu::WriterBase::sendWriteDateTimePacket((WriterBase *)this,(DateTimeData *)local_60);
  return (int)(writer.super_WriterBase._vptr_WriterBase != (_func_int **)0x6);
}

Assistant:

int main(int argc, char* argv[]) {
  ApplicationXimuWriter writer;

  writer.sendCommandPacket(ximu::CommandCodes::ALGORITHM_CLEAR_TARE);
  writer.sendCommandPacket(ximu::CommandCodes::ALGORITHM_INITIALISE_THEN_TARE);

  ximu::RegisterData reg(ximu::reg::ACCELEROMETER_BIAS_X, 1.0f);
  writer.sendReadRegisterPacket(reg);
  writer.sendWriteRegisterPacket(reg);

  writer.sendReadDateTimePacket();
  ximu::DateTimeData dt;
  writer.sendWriteDateTimePacket(dt);

  if (writer.SendCount() != 6)
    return 1;

  return 0;
}